

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

Nonnull<cord_internal::CordRepFlat_*> __thiscall
absl::lts_20250127::Cord::InlineRep::MakeFlatWithExtraCapacity(InlineRep *this,size_t extra)

{
  size_t sVar1;
  CordRepFlat *this_00;
  char *dst;
  CordRepFlat *result;
  size_t len;
  size_t extra_local;
  InlineRep *this_local;
  
  sVar1 = cord_internal::InlineData::inline_size(&this->data_);
  this_00 = cord_internal::CordRepFlat::New(sVar1 + extra);
  (this_00->super_CordRep).length = sVar1;
  dst = cord_internal::CordRepFlat::Data(this_00);
  cord_internal::InlineData::copy_max_inline_to(&this->data_,dst);
  return this_00;
}

Assistant:

inline absl::Nonnull<cord_internal::CordRepFlat*>
Cord::InlineRep::MakeFlatWithExtraCapacity(size_t extra) {
  static_assert(cord_internal::kMinFlatLength >= sizeof(data_), "");
  size_t len = data_.inline_size();
  auto* result = CordRepFlat::New(len + extra);
  result->length = len;
  data_.copy_max_inline_to(result->Data());
  return result;
}